

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

FieldSubset * __thiscall
capnp::StructSchema::getUnionFields(FieldSubset *__return_storage_ptr__,StructSchema *this)

{
  uint16_t *indices;
  Reader list;
  uint16_t uVar1;
  Reader local_a8;
  Schema local_78;
  Reader local_70;
  undefined1 local_40 [8];
  Reader proto;
  StructSchema *this_local;
  
  proto._reader._40_8_ = this;
  Schema::getProto(&local_70,&this->super_Schema);
  capnp::schema::Node::Reader::getStruct((Reader *)local_40,&local_70);
  local_78.raw = (this->super_Schema).raw;
  capnp::schema::Node::Struct::Reader::getFields(&local_a8,(Reader *)local_40);
  indices = ((this->super_Schema).raw)->generic->membersByDiscriminant;
  uVar1 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_40);
  list.reader.capTable = local_a8.reader.capTable;
  list.reader.segment = local_a8.reader.segment;
  list.reader.ptr = local_a8.reader.ptr;
  list.reader.elementCount = local_a8.reader.elementCount;
  list.reader.step = local_a8.reader.step;
  list.reader.structDataSize = local_a8.reader.structDataSize;
  list.reader.structPointerCount = local_a8.reader.structPointerCount;
  list.reader.elementSize = local_a8.reader.elementSize;
  list.reader._39_1_ = local_a8.reader._39_1_;
  list.reader.nestingLimit = local_a8.reader.nestingLimit;
  list.reader._44_4_ = local_a8.reader._44_4_;
  FieldSubset::FieldSubset
            (__return_storage_ptr__,(StructSchema)local_78.raw,list,indices,(uint)uVar1);
  return __return_storage_ptr__;
}

Assistant:

StructSchema::FieldSubset StructSchema::getUnionFields() const {
  auto proto = getProto().getStruct();
  return FieldSubset(*this, proto.getFields(),
                     raw->generic->membersByDiscriminant, proto.getDiscriminantCount());
}